

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::DWARFUnit::getAddrOffsetSectionItem
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,DWARFUnit *this,
          uint32_t Index)

{
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar1;
  uint64_t uVar2;
  bool bVar3;
  unit_iterator_range uVar4;
  DWARFDataExtractor local_50;
  ulong local_28;
  uint64_t Offset;
  
  while (this->IsDWO == true) {
    uVar4 = DWARFContext::info_section_units(this->Context);
    puVar1 = uVar4.begin_iterator;
    if ((puVar1 == uVar4.end_iterator) || (puVar1 + 1 != uVar4.end_iterator)) break;
    this = (puVar1->_M_t).
           super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
           super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
  }
  local_50.super_DataExtractor.AddressSize = (this->Header).FormParams.AddrSize;
  local_28 = (ulong)(Index * local_50.super_DataExtractor.AddressSize + this->AddrOffsetSectionBase)
  ;
  local_50.Section = this->AddrOffsetSection;
  local_50.super_DataExtractor.Data.Length = ((local_50.Section)->Data).Length;
  bVar3 = local_28 + local_50.super_DataExtractor.AddressSize <=
          local_50.super_DataExtractor.Data.Length;
  if (bVar3) {
    local_50.Obj = (this->Context->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    local_50.super_DataExtractor.IsLittleEndian = this->isLittleEndian;
    local_50.super_DataExtractor.Data.Data = ((local_50.Section)->Data).Data;
    uVar2 = DWARFDataExtractor::getRelocatedAddress
                      (&local_50,&local_28,
                       &(__return_storage_ptr__->Storage).field_0.value.SectionIndex);
    (__return_storage_ptr__->Storage).field_0.value.Address = uVar2;
  }
  else {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
  }
  (__return_storage_ptr__->Storage).hasVal = bVar3;
  return __return_storage_ptr__;
}

Assistant:

Optional<object::SectionedAddress>
DWARFUnit::getAddrOffsetSectionItem(uint32_t Index) const {
  if (IsDWO) {
    auto R = Context.info_section_units();
    auto I = R.begin();
    // Surprising if a DWO file has more than one skeleton unit in it - this
    // probably shouldn't be valid, but if a use case is found, here's where to
    // support it (probably have to linearly search for the matching skeleton CU
    // here)
    if (I != R.end() && std::next(I) == R.end())
      return (*I)->getAddrOffsetSectionItem(Index);
  }
  uint64_t Offset = AddrOffsetSectionBase + Index * getAddressByteSize();
  if (AddrOffsetSection->Data.size() < Offset + getAddressByteSize())
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), *AddrOffsetSection,
                        isLittleEndian, getAddressByteSize());
  uint64_t Section;
  uint64_t Address = DA.getRelocatedAddress(&Offset, &Section);
  return {{Address, Section}};
}